

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void __thiscall section_data::polygon_to_gds(section_data *this,string *outpath)

{
  _Base_ptr p_Var1;
  char *corY;
  _Base_ptr corX;
  void *__buf;
  _Rb_tree_header *p_Var2;
  _Self __tmp;
  gdsSTR main;
  gdscpp my_polygons;
  gdsSTR local_348;
  gdscpp local_250;
  gdsBOUNDARY local_190;
  gdsSTR local_128;
  
  gdscpp::gdscpp(&local_250);
  local_348.name._M_dataplus._M_p = (pointer)&local_348.name.field_2;
  local_348.name._M_string_length = 0;
  local_348.name.field_2._M_local_buf[0] = '\0';
  local_348.heirarchical_level = 0;
  local_348.bounding_box[0] = 0;
  local_348.bounding_box[1] = 0;
  local_348.bounding_box[2] = 0;
  local_348.bounding_box[3] = 0;
  memset(&local_348.last_modified,0,0xc0);
  corY = "Polygons";
  std::__cxx11::string::_M_replace((ulong)&local_348,0,(char *)0x0,0x177bcc);
  p_Var1 = (this->polygons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->polygons)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      corX = p_Var1[1]._M_parent;
      if (corX < p_Var1[1]._M_left) {
        do {
          corY = (char *)&corX->_M_right;
          drawBoundary(&local_190,p_Var1[1]._M_color,(vector<int,_std::allocator<int>_> *)corX,
                       (vector<int,_std::allocator<int>_> *)corY);
          std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
                    (&local_348.BOUNDARY,&local_190);
          gdsBOUNDARY::~gdsBOUNDARY(&local_190);
          corX = (_Base_ptr)&corX[1]._M_left;
        } while (corX < p_Var1[1]._M_left);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  gdsSTR::gdsSTR(&local_128,&local_348);
  gdscpp::setSTR(&local_250,&local_128);
  gdsSTR::~gdsSTR(&local_128);
  gdscpp::write(&local_250,(int)outpath,__buf,(size_t)corY);
  gdsSTR::~gdsSTR(&local_348);
  gdscpp::~gdscpp(&local_250);
  return;
}

Assistant:

void section_data::polygon_to_gds(const string &outpath)
{
  gdscpp my_polygons;
  gdsSTR main;
  main.name = "Polygons";
  vector<int> x_cor, y_cor;
  // std::map<unsigned int, std::vector<co_ord>> polygons; // key = layer number
  for (auto polymap_it = polygons.begin(); polymap_it != polygons.end();
       polymap_it++) {
    for (auto layer_polygon_it = polymap_it->second.begin();
         layer_polygon_it < polymap_it->second.end(); layer_polygon_it++) {
      main.BOUNDARY.push_back(drawBoundary(
          polymap_it->first, layer_polygon_it->x, layer_polygon_it->y));
    }
  }
  my_polygons.setSTR(main);
  my_polygons.write(outpath);
}